

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O0

void __thiscall
Measurement::Measurement(Measurement *this,Sensor *sensor,long timestamp,VectorXd *measurements)

{
  VectorXd *measurements_local;
  long timestamp_local;
  Sensor *sensor_local;
  Measurement *this_local;
  
  this->_vptr_Measurement = (_func_int **)&PTR___cxa_pure_virtual_002d4b88;
  this->sensor_ = sensor;
  this->timestamp_ = timestamp;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->measurements_,measurements);
  this->nis_ = 0.0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->estimate_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->ground_truth_);
  return;
}

Assistant:

Measurement::Measurement(const Sensor *sensor, long timestamp, const VectorXd& measurements) :
        sensor_(sensor),
	timestamp_(timestamp),
	measurements_(measurements),
	nis_(0.0)
{
    //std::cout << measurements_.transpose() << std::endl;
}